

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

int av1_loop_restoration_corners_in_sb
              (AV1Common *cm,int plane,int mi_row,int mi_col,BLOCK_SIZE bsize,int *rcol0,int *rcol1,
              int *rrow0,int *rrow1)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  AV1_COMMON *in_RDI;
  BLOCK_SIZE in_R8B;
  int *in_R9;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int rnd_y;
  int rnd_x;
  int denom_y;
  int denom_x;
  int mi_to_num_y;
  int mi_to_num_x;
  int mi_size_y;
  int mi_size_x;
  int ss_y;
  int ss_x;
  int vert_units;
  int horz_units;
  int size;
  RestorationInfo *rsi;
  int mi_col1;
  int mi_row1;
  int mi_col0;
  int mi_row0;
  int is_uv;
  bool local_91;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  bool local_7e;
  bool local_7d;
  uint local_4;
  
  if (in_R8B == in_RDI->seq_params->sb_size) {
    bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_R8B];
    bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_R8B];
    iVar3 = in_RDI->rst_info[in_ESI].restoration_unit_size;
    local_8c = in_RDI->rst_info[in_ESI].horz_units;
    local_90 = in_RDI->rst_info[in_ESI].vert_units;
    local_7d = false;
    if (0 < in_ESI) {
      local_7d = in_RDI->seq_params->subsampling_x != 0;
    }
    local_7e = false;
    if (0 < in_ESI) {
      local_7e = in_RDI->seq_params->subsampling_y != 0;
    }
    local_84 = 4 >> local_7d;
    iVar4 = 4 >> local_7e;
    iVar5 = av1_superres_scaled(in_RDI);
    if (iVar5 != 0) {
      local_84 = local_84 * (uint)in_RDI->superres_scale_denominator;
    }
    iVar5 = av1_superres_scaled(in_RDI);
    local_88 = iVar3;
    if (iVar5 != 0) {
      local_88 = iVar3 << 3;
    }
    iVar5 = local_88 + -1;
    iVar6 = iVar3 + -1;
    *in_R9 = (in_ECX * local_84 + iVar5) / local_88;
    *in_stack_00000010 = (in_EDX * iVar4 + iVar6) / iVar3;
    if ((int)((in_ECX + (uint)bVar2) * local_84 + iVar5) / local_88 < local_8c) {
      local_8c = (int)((in_ECX + (uint)bVar2) * local_84 + iVar5) / local_88;
    }
    *in_stack_00000008 = local_8c;
    if ((int)((in_EDX + (uint)bVar1) * iVar4 + iVar6) / iVar3 < local_90) {
      local_90 = (int)((in_EDX + (uint)bVar1) * iVar4 + iVar6) / iVar3;
    }
    *in_stack_00000018 = local_90;
    local_91 = false;
    if (*in_R9 < *in_stack_00000008) {
      local_91 = *in_stack_00000010 < *in_stack_00000018;
    }
    local_4 = (uint)local_91;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int av1_loop_restoration_corners_in_sb(const struct AV1Common *cm, int plane,
                                       int mi_row, int mi_col, BLOCK_SIZE bsize,
                                       int *rcol0, int *rcol1, int *rrow0,
                                       int *rrow1) {
  assert(rcol0 && rcol1 && rrow0 && rrow1);

  if (bsize != cm->seq_params->sb_size) return 0;

  assert(!cm->features.all_lossless);

  const int is_uv = plane > 0;

  // Compute the mi-unit corners of the superblock
  const int mi_row0 = mi_row;
  const int mi_col0 = mi_col;
  const int mi_row1 = mi_row0 + mi_size_high[bsize];
  const int mi_col1 = mi_col0 + mi_size_wide[bsize];

  const RestorationInfo *rsi = &cm->rst_info[plane];
  const int size = rsi->restoration_unit_size;
  const int horz_units = rsi->horz_units;
  const int vert_units = rsi->vert_units;

  // The size of an MI-unit on this plane of the image
  const int ss_x = is_uv && cm->seq_params->subsampling_x;
  const int ss_y = is_uv && cm->seq_params->subsampling_y;
  const int mi_size_x = MI_SIZE >> ss_x;
  const int mi_size_y = MI_SIZE >> ss_y;

  // Write m for the relative mi column or row, D for the superres denominator
  // and N for the superres numerator. If u is the upscaled pixel offset then
  // we can write the downscaled pixel offset in two ways as:
  //
  //   MI_SIZE * m = N / D u
  //
  // from which we get u = D * MI_SIZE * m / N
  const int mi_to_num_x = av1_superres_scaled(cm)
                              ? mi_size_x * cm->superres_scale_denominator
                              : mi_size_x;
  const int mi_to_num_y = mi_size_y;
  const int denom_x = av1_superres_scaled(cm) ? size * SCALE_NUMERATOR : size;
  const int denom_y = size;

  const int rnd_x = denom_x - 1;
  const int rnd_y = denom_y - 1;

  // rcol0/rrow0 should be the first column/row of restoration units that
  // doesn't start left/below of mi_col/mi_row. For this calculation, we need
  // to round up the division (if the sb starts at runit column 10.1, the first
  // matching runit has column index 11)
  *rcol0 = (mi_col0 * mi_to_num_x + rnd_x) / denom_x;
  *rrow0 = (mi_row0 * mi_to_num_y + rnd_y) / denom_y;

  // rel_col1/rel_row1 is the equivalent calculation, but for the superblock
  // below-right. If we're at the bottom or right of the frame, this restoration
  // unit might not exist, in which case we'll clamp accordingly.
  *rcol1 = AOMMIN((mi_col1 * mi_to_num_x + rnd_x) / denom_x, horz_units);
  *rrow1 = AOMMIN((mi_row1 * mi_to_num_y + rnd_y) / denom_y, vert_units);

  return *rcol0 < *rcol1 && *rrow0 < *rrow1;
}